

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ODUPCEWriter.cpp
# Opt level: O0

BitMatrix * __thiscall
ZXing::OneD::UPCEWriter::encode(UPCEWriter *this,string *contents,int width,int height)

{
  string *in_RDX;
  BitMatrix *in_RDI;
  string_view in_stack_ffffffffffffffc0;
  
  std::__cxx11::string::operator_cast_to_basic_string_view(in_RDX);
  FromUtf8_abi_cxx11_(in_stack_ffffffffffffffc0);
  encode(this,(wstring *)contents,width,height);
  std::__cxx11::wstring::~wstring((wstring *)&stack0xffffffffffffffc0);
  return in_RDI;
}

Assistant:

BitMatrix UPCEWriter::encode(const std::string& contents, int width, int height) const
{
	return encode(FromUtf8(contents), width, height);
}